

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_CountInv(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                      VMReturn *ret,int numret)

{
  bool bVar1;
  AActor *pAVar2;
  AInventory *pAVar3;
  int val;
  char *pcVar4;
  PClassActor *type;
  
  if (numret < 1) {
    return 0;
  }
  if (ret == (VMReturn *)0x0) {
    __assert_fail("ret != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x143,
                  "int AF_AActor_CountInv(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_003d7498;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003d7460:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003d7498:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x144,
                  "int AF_AActor_CountInv(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  pAVar2 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar2 == (AActor *)0x0) goto LAB_003d738e;
    bVar1 = DObject::IsKindOf((DObject *)pAVar2,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003d7498;
    }
  }
  else {
    if (pAVar2 != (AActor *)0x0) goto LAB_003d7460;
LAB_003d738e:
    pAVar2 = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_003d74df;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_003d7469:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003d74df:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x145,
                  "int AF_AActor_CountInv(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  type = (PClassActor *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (type == (PClassActor *)0x0) goto LAB_003d73e5;
    bVar1 = PClass::IsAncestorOf(AInventory::RegistrationInfo.MyClass,(PClass *)type);
    if (!bVar1) {
      pcVar4 = "itemtype == NULL || itemtype->IsDescendantOf(RUNTIME_CLASS(AInventory))";
      goto LAB_003d74df;
    }
    bVar1 = false;
  }
  else {
    if (type != (PClassActor *)0x0) goto LAB_003d7469;
LAB_003d73e5:
    bVar1 = true;
    type = (PClassActor *)0x0;
  }
  if ((uint)numparam < 3) {
    param = defaultparam->Array;
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_003d74c0;
    }
  }
  else if (param[2].field_0.field_3.Type != '\0') {
    pcVar4 = "(param[paramnum]).Type == REGT_INT";
LAB_003d74c0:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x146,
                  "int AF_AActor_CountInv(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  pAVar2 = COPY_AAPTR(pAVar2,param[2].field_0.i);
  val = 0;
  if (!bVar1 && pAVar2 != (AActor *)0x0) {
    val = 0;
    pAVar3 = AActor::FindInventory(pAVar2,type,false);
    if (pAVar3 != (AInventory *)0x0) {
      val = pAVar3->Amount;
    }
  }
  VMReturn::SetInt(ret,val);
  return 1;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, CountInv)
{
	if (numret > 0)
	{
		assert(ret != NULL);
		PARAM_SELF_PROLOGUE(AActor);
		PARAM_CLASS(itemtype, AInventory);
		PARAM_INT_DEF(pick_pointer);

		self = COPY_AAPTR(self, pick_pointer);
		if (self == NULL || itemtype == NULL)
		{
			ret->SetInt(0);
		}
		else
		{
			AInventory *item = self->FindInventory(itemtype);
			ret->SetInt(item ? item->Amount : 0);
		}
		return 1;
	}
	return 0;
}